

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O1

Expression *
slang::ast::SimpleAssignmentPatternExpression::forDynamicArray
          (Compilation *comp,SimpleAssignmentPatternSyntax *syntax,ASTContext *context,Type *type,
          Type *elementType,SourceRange sourceRange)

{
  SourceRange sourceRange_00;
  Expression *expr;
  bool bad;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> elems;
  bool *in_stack_ffffffffffffffc0;
  char local_31;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_30;
  
  local_31 = '\0';
  sourceRange_00.endLoc = (SourceLocation)&local_31;
  sourceRange_00.startLoc = sourceRange.endLoc;
  local_30 = bindExpressionList((ast *)type,elementType,(Type *)0x1,0,(int)syntax + 0x20,
                                (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)context,
                                (ASTContext *)sourceRange.startLoc,sourceRange_00,
                                in_stack_ffffffffffffffc0);
  expr = (Expression *)
         BumpAllocator::
         emplace<slang::ast::SimpleAssignmentPatternExpression,slang::ast::Type_const&,nonstd::span_lite::span<slang::ast::Expression_const*const,18446744073709551615ul>&,slang::SourceRange&>
                   (&comp->super_BumpAllocator,type,&local_30,&sourceRange);
  if (local_31 == '\x01') {
    expr = Expression::badExpr(comp,expr);
  }
  return expr;
}

Assistant:

Expression& SimpleAssignmentPatternExpression::forDynamicArray(
    Compilation& comp, const SimpleAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Type& elementType, SourceRange sourceRange) {

    bool bad = false;
    auto elems = bindExpressionList(type, elementType, 1, 0, syntax.items, context, sourceRange,
                                    bad);

    auto result = comp.emplace<SimpleAssignmentPatternExpression>(type, elems, sourceRange);
    if (bad)
        return badExpr(comp, result);

    return *result;
}